

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

void discover_cursed_equip(obj *otmp)

{
  long lVar1;
  char *pcVar2;
  
  if (((otmp != (obj *)0x0) && ((*(uint *)&otmp->field_0x4a & 1) != 0)) &&
     (*(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a | 0x40, flags.verbose != '\0')) {
    pcVar2 = "they feel";
    if (((otmp->quan < 2) && (otmp->oartifact != '\x1d')) &&
       (lVar1 = (long)otmp->otyp, lVar1 != 0xed)) {
      if (otmp->oclass == '\x03') {
        pcVar2 = "that feels";
        if (objects[lVar1].oc_subtyp == '\x04') {
          pcVar2 = "they feel";
        }
        else if (objects[lVar1].oc_subtyp == '\x03') {
          pcVar2 = "they feel";
        }
      }
      else {
        pcVar2 = "that feels";
      }
    }
    pline("Oops; %s deathly cold.",pcVar2);
    return;
  }
  return;
}

Assistant:

static void discover_cursed_equip(struct obj *otmp)
{
	if (otmp && otmp->cursed) {
	    otmp->bknown = TRUE;
	    if (flags.verbose) {
		pline("Oops; %s deathly cold.",
		      (is_plural(otmp) || otmp->otyp == LENSES ||
		       is_boots(otmp) || is_gloves(otmp)) ?
		      "they feel" : "that feels");
	    }
	}
}